

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Bits testing::internal::FloatingPoint<float>::DistanceBetweenSignAndMagnitudeNumbers
               (Bits *sam1,Bits *sam2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Bits BVar4;
  
  uVar1 = *sam1;
  uVar2 = uVar1 | 0x80000000;
  if ((int)uVar1 < 0) {
    uVar2 = -uVar1;
  }
  uVar1 = *sam2;
  uVar3 = uVar1 | 0x80000000;
  if ((int)uVar1 < 0) {
    uVar3 = -uVar1;
  }
  BVar4 = uVar2 - uVar3;
  if (uVar2 < uVar3) {
    BVar4 = -(uVar2 - uVar3);
  }
  return BVar4;
}

Assistant:

static Bits SignAndMagnitudeToBiased(const Bits& sam) {
    if (kSignBitMask & sam) {
      // sam represents a negative number.
      return ~sam + 1;
    } else {
      // sam represents a positive number.
      return kSignBitMask | sam;
    }
  }